

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O0

ssize_t __thiscall diffusion::NetReader::read(NetReader *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  ssize_t extraout_RAX;
  ErrorNoData *this_00;
  undefined4 in_register_00000034;
  allocator_type local_31;
  undefined1 local_30 [8];
  vector<char,_std::allocator<char>_> data;
  vector<char,_std::allocator<char>_> *buffer_local;
  NetReader *this_local;
  
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = in_register_00000034;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = __fd;
  uVar1 = (**(this->super_Reader)._vptr_Reader)();
  if ((uVar1 & 1) == 0) {
    this_00 = (ErrorNoData *)__cxa_allocate_exception(0x10);
    ErrorNoData::ErrorNoData(this_00);
    __cxa_throw(this_00,&ErrorNoData::typeinfo,ErrorNoData::~ErrorNoData);
  }
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_30,0,&local_31);
  std::allocator<char>::~allocator(&local_31);
  Tokenizer::pop(&this->data_queue_,(vector<char,_std::allocator<char>_> *)local_30);
  std::vector<char,_std::allocator<char>_>::operator=
            ((vector<char,_std::allocator<char>_> *)
             data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
             (vector<char,_std::allocator<char>_> *)local_30);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_30)
  ;
  return extraout_RAX;
}

Assistant:

void NetReader::read(std::vector<char> &buffer) {
    if (this->can_read()) {
        // Assuming single thread.
        std::vector<char> data(0);
        data_queue_.pop(data);
        buffer = data;
    } else {
        throw ErrorNoData();
    }
}